

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O3

REF_STATUS ref_face_with(REF_FACE ref_face,REF_INT *nodes,REF_INT *face)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  uint uVar4;
  uint uVar5;
  REF_ADJ_ITEM pRVar6;
  long lVar7;
  long lVar8;
  REF_INT candidate [4];
  REF_INT target [4];
  REF_INT orig [4];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  REF_INT local_48 [6];
  
  *face = -1;
  uVar4 = ref_face_make_canonical(nodes,&local_58);
  if (uVar4 == 0) {
    iVar1 = *nodes;
    uVar4 = 5;
    if (((-1 < (long)iVar1) && (pRVar2 = ref_face->adj, iVar1 < pRVar2->nnode)) &&
       (lVar8 = (long)pRVar2->first[iVar1], lVar8 != -1)) {
      pRVar6 = pRVar2->item;
      do {
        iVar1 = pRVar6[lVar8].ref;
        pRVar3 = ref_face->f2n;
        lVar7 = 0;
        do {
          local_48[lVar7] = pRVar3[(long)iVar1 * 4 + lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        uVar5 = ref_face_make_canonical(local_48,&local_68);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",
                 0x8e,"ref_face_with",(ulong)uVar5,"canonical");
          return uVar5;
        }
        if (((local_58 == local_68) && (local_54 == local_64)) &&
           ((local_50 == local_60 && (local_4c == local_5c)))) {
          *face = iVar1;
          return 0;
        }
        pRVar6 = ref_face->adj->item;
        lVar8 = (long)pRVar6[(int)lVar8].next;
      } while (lVar8 != -1);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x89,
           "ref_face_with",(ulong)uVar4,"canonical");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_face_with(REF_FACE ref_face, REF_INT *nodes,
                                 REF_INT *face) {
  REF_INT item, ref, node;
  REF_INT target[4], candidate[4], orig[4];

  (*face) = REF_EMPTY;

  RSS(ref_face_make_canonical(nodes, target), "canonical");

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), nodes[0], item, ref) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, ref);
    RSS(ref_face_make_canonical(orig, candidate), "canonical");
    if (target[0] == candidate[0] && target[1] == candidate[1] &&
        target[2] == candidate[2] && target[3] == candidate[3]) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}